

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O1

ostream * tcu::Format::operator<<(ostream *str,Array<const_signed_char_*> *fmt)

{
  char *pcVar1;
  char local_29;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  pcVar1 = fmt->begin;
  if (pcVar1 != fmt->end) {
    do {
      if (pcVar1 != fmt->begin) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      local_29 = *pcVar1;
      std::__ostream_insert<char,std::char_traits<char>>(str,&local_29,1);
      pcVar1 = pcVar1 + 1;
    } while (pcVar1 != fmt->end);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}